

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locdspnm.cpp
# Opt level: O2

int32_t uldn_keyDisplayName_63
                  (ULocaleDisplayNames *ldn,char *key,UChar *result,int32_t maxResultSize,
                  UErrorCode *pErrorCode)

{
  int32_t iVar1;
  UnicodeString temp;
  Char16Ptr local_88;
  UChar *local_80;
  UnicodeString local_70;
  
  if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if (key != (char *)0x0 && ldn != (ULocaleDisplayNames *)0x0) {
      if ((-1 < maxResultSize) && (result != (UChar *)0x0 || maxResultSize < 1)) {
        icu_63::UnicodeString::UnicodeString(&local_70,result,0,maxResultSize);
        (**(code **)(*(long *)ldn + 0x68))(ldn,key,&local_70);
        local_88.p_ = result;
        iVar1 = icu_63::UnicodeString::extract(&local_70,&local_88,maxResultSize,pErrorCode);
        local_80 = local_88.p_;
        icu_63::UnicodeString::~UnicodeString(&local_70);
        return iVar1;
      }
    }
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
  }
  return 0;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uldn_keyDisplayName(const ULocaleDisplayNames *ldn,
                    const char *key,
                    UChar *result,
                    int32_t maxResultSize,
                    UErrorCode *pErrorCode) {
  if (U_FAILURE(*pErrorCode)) {
    return 0;
  }
  if (ldn == NULL || key == NULL || (result == NULL && maxResultSize > 0) || maxResultSize < 0) {
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    return 0;
  }
  UnicodeString temp(result, 0, maxResultSize);
  ((const LocaleDisplayNames *)ldn)->keyDisplayName(key, temp);
  return temp.extract(result, maxResultSize, *pErrorCode);
}